

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O3

void tbx_set_meta(tbx_t *tbx)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uVar6;
  void *__ptr;
  size_t sVar7;
  uint8_t *meta;
  int iVar8;
  byte bVar9;
  ulong uVar10;
  
  puVar3 = (uint *)tbx->dict;
  uVar1 = puVar3[1];
  __ptr = malloc((ulong)uVar1 * 8);
  uVar2 = *puVar3;
  if ((ulong)uVar2 == 0) {
    iVar8 = 0;
  }
  else {
    lVar4 = *(long *)(puVar3 + 4);
    bVar9 = 0;
    uVar10 = 0;
    iVar8 = 0;
    do {
      if ((*(uint *)(lVar4 + (uVar10 >> 4 & 0xfffffff) * 4) >> (bVar9 & 0x1e) & 3) == 0) {
        pcVar5 = *(char **)(*(long *)(puVar3 + 6) + uVar10 * 8);
        *(char **)((long)__ptr + *(long *)(*(long *)(puVar3 + 8) + uVar10 * 8) * 8) = pcVar5;
        sVar7 = strlen(pcVar5);
        iVar8 = iVar8 + (int)sVar7 + 1;
      }
      uVar10 = uVar10 + 1;
      bVar9 = bVar9 + 2;
    } while (uVar2 != uVar10);
  }
  meta = (uint8_t *)malloc((long)(iVar8 + 0x1c));
  uVar6 = *(undefined8 *)&(tbx->conf).bc;
  *(undefined8 *)meta = *(undefined8 *)&tbx->conf;
  *(undefined8 *)(meta + 8) = uVar6;
  *(undefined8 *)(meta + 0x10) = *(undefined8 *)&(tbx->conf).meta_char;
  *(int *)(meta + 0x18) = iVar8;
  if ((int)uVar1 < 1) {
    iVar8 = 0x1c;
  }
  else {
    iVar8 = 0x1c;
    uVar10 = 0;
    do {
      pcVar5 = *(char **)((long)__ptr + uVar10 * 8);
      sVar7 = strlen(pcVar5);
      memcpy(meta + iVar8,pcVar5,(long)((int)sVar7 + 1));
      iVar8 = iVar8 + (int)sVar7 + 1;
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar1);
  }
  free(__ptr);
  hts_idx_set_meta(tbx->idx,iVar8,meta,0);
  return;
}

Assistant:

void tbx_set_meta(tbx_t *tbx)
{
    int i, l = 0, l_nm;
    uint32_t x[7];
    char **name;
    uint8_t *meta;
    khint_t k;
    khash_t(s2i) *d = (khash_t(s2i)*)tbx->dict;

    memcpy(x, &tbx->conf, 24);
    name = (char**)malloc(sizeof(char*) * kh_size(d));
    for (k = kh_begin(d), l = 0; k != kh_end(d); ++k) {
        if (!kh_exist(d, k)) continue;
        name[kh_val(d, k)] = (char*)kh_key(d, k);
        l += strlen(kh_key(d, k)) + 1; // +1 to include '\0'
    }
    l_nm = x[6] = l;
    meta = (uint8_t*)malloc(l_nm + 28);
    if (ed_is_big())
        for (i = 0; i < 7; ++i)
            x[i] = ed_swap_4(x[i]);
    memcpy(meta, x, 28);
    for (l = 28, i = 0; i < (int)kh_size(d); ++i) {
        int x = strlen(name[i]) + 1;
        memcpy(meta + l, name[i], x);
        l += x;
    }
    free(name);
    hts_idx_set_meta(tbx->idx, l, meta, 0);
}